

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::BindingImagesTest(BindingImagesTest *this,Context *context)

{
  Context *context_local;
  BindingImagesTest *this_local;
  
  BindingImageTest::BindingImageTest
            (&this->super_BindingImageTest,context,"binding_images",
             "Test verifies binding of images");
  (this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__BindingImagesTest_03246f28;
  Utils::texture::texture(&this->m_goku_texture,context);
  Utils::texture::texture(&this->m_vegeta_texture,context);
  Utils::texture::texture(&this->m_trunks_texture,context);
  Utils::buffer::buffer(&this->m_goku_buffer,context);
  Utils::buffer::buffer(&this->m_vegeta_buffer,context);
  Utils::buffer::buffer(&this->m_trunks_buffer,context);
  return;
}

Assistant:

BindingImagesTest::BindingImagesTest(deqp::Context& context)
	: BindingImageTest(context, "binding_images", "Test verifies binding of images")
	, m_goku_texture(context)
	, m_vegeta_texture(context)
	, m_trunks_texture(context)
	, m_goku_buffer(context)
	, m_vegeta_buffer(context)
	, m_trunks_buffer(context)
{
	/* Nothing to be done here */
}